

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O1

void auxsort(lua_State *L,IdxT lo,IdxT up,uint rnd)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  clock_t cVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong n;
  ulong n_00;
  uint lo_00;
  ulong n_01;
  ulong n_02;
  uint uVar9;
  long lVar10;
  uint local_64;
  clock_t local_48;
  time_t local_40;
  
  n_01 = (ulong)lo;
  local_64 = rnd;
  do {
    lo_00 = (uint)n_01;
    uVar9 = up - lo_00;
    if (up < lo_00 || uVar9 == 0) {
      return;
    }
    lua_geti(L,1,n_01);
    uVar8 = (ulong)up;
    lua_geti(L,1,uVar8);
    iVar2 = sort_comp(L,-1,-2);
    if (iVar2 == 0) {
      lua_settop(L,-3);
    }
    else {
      lua_seti(L,1,n_01);
      lua_seti(L,1,uVar8);
    }
    if (uVar9 == 1) {
      bVar1 = false;
    }
    else {
      if ((uVar9 < 100) || (local_64 == 0)) {
        uVar7 = up + lo_00 >> 1;
      }
      else {
        uVar5 = uVar9 >> 2;
        uVar6 = local_64 % (uVar5 * 2);
        uVar7 = uVar6 + uVar5 + lo_00;
        if ((CARRY4(uVar6,uVar5 + lo_00)) || (up - uVar5 < uVar7)) {
          __assert_fail("lo + r4 <= p && p <= up - r4",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltablib.c"
                        ,0x15d,"IdxT choosePivot(IdxT, IdxT, unsigned int)");
        }
      }
      n_02 = (ulong)uVar7;
      lua_geti(L,1,n_02);
      lua_geti(L,1,n_01);
      iVar2 = sort_comp(L,-2,-1);
      if (iVar2 == 0) {
        lua_settop(L,-2);
        lua_geti(L,1,uVar8);
        iVar2 = sort_comp(L,-1,-2);
        if (iVar2 != 0) {
          lua_seti(L,1,n_02);
          goto LAB_0013f9d0;
        }
        lua_settop(L,-3);
      }
      else {
        lua_seti(L,1,n_02);
        uVar8 = n_01;
LAB_0013f9d0:
        lua_seti(L,1,uVar8);
      }
      if (uVar9 == 2) {
        bVar1 = false;
      }
      else {
        lua_geti(L,1,n_02);
        lua_pushvalue(L,-1);
        n_00 = (ulong)(up - 1);
        lua_geti(L,1,n_00);
        uVar8 = n_00;
        n = n_01;
        do {
          lua_seti(L,1,n_02);
          lua_seti(L,1,uVar8);
          iVar2 = (int)n;
          n = (ulong)(iVar2 + 1);
          lua_geti(L,1,n);
          iVar3 = sort_comp(L,-1,-2);
          n_02 = n;
          if (iVar3 != 0) {
            uVar9 = iVar2 + 2;
            do {
              uVar7 = uVar9;
              if (up == uVar7) {
                luaL_error(L,"invalid order function for sorting");
              }
              lua_settop(L,-2);
              n_02 = (ulong)uVar7;
              lua_geti(L,1,n_02);
              iVar2 = sort_comp(L,-1,-2);
              uVar9 = uVar7 + 1;
            } while (iVar2 != 0);
            n = (ulong)uVar7;
          }
          while( true ) {
            uVar7 = (int)uVar8 - 1;
            uVar8 = (ulong)uVar7;
            lua_geti(L,1,uVar8);
            iVar2 = sort_comp(L,-3,-1);
            uVar9 = (uint)n;
            if (iVar2 == 0) break;
            if (uVar7 < uVar9) {
              luaL_error(L,"invalid order function for sorting");
            }
            lua_settop(L,-2);
          }
        } while (uVar9 <= uVar7);
        lua_settop(L,-2);
        lua_seti(L,1,n_00);
        lua_seti(L,1,n_02);
        uVar7 = up - uVar9;
        if (uVar9 - lo_00 < uVar7) {
          auxsort(L,lo_00,uVar9 - 1,local_64);
          n_01 = (ulong)(uVar9 + 1);
          uVar7 = uVar9 - lo_00;
        }
        else {
          auxsort(L,uVar9 + 1,up,local_64);
          up = uVar9 - 1;
        }
        bVar1 = true;
        if (uVar7 < up - (int)n_01 >> 7) {
          cVar4 = clock();
          lVar10 = 0;
          local_40 = time((time_t *)0x0);
          local_48 = cVar4;
          local_64 = 0;
          do {
            local_64 = local_64 + *(int *)((long)&local_48 + lVar10 * 4);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 4);
        }
      }
    }
    if (!bVar1) {
      return;
    }
  } while( true );
}

Assistant:

static void auxsort (lua_State *L, IdxT lo, IdxT up,
                                   unsigned int rnd) {
  while (lo < up) {  /* loop for tail recursion */
    IdxT p;  /* Pivot index */
    IdxT n;  /* to be used later */
    /* sort elements 'lo', 'p', and 'up' */
    lua_geti(L, 1, lo);
    lua_geti(L, 1, up);
    if (sort_comp(L, -1, -2))  /* a[up] < a[lo]? */
      set2(L, lo, up);  /* swap a[lo] - a[up] */
    else
      lua_pop(L, 2);  /* remove both values */
    if (up - lo == 1)  /* only 2 elements? */
      return;  /* already sorted */
    if (up - lo < RANLIMIT || rnd == 0)  /* small interval or no randomize? */
      p = (lo + up)/2;  /* middle element is a good pivot */
    else  /* for larger intervals, it is worth a random pivot */
      p = choosePivot(lo, up, rnd);
    lua_geti(L, 1, p);
    lua_geti(L, 1, lo);
    if (sort_comp(L, -2, -1))  /* a[p] < a[lo]? */
      set2(L, p, lo);  /* swap a[p] - a[lo] */
    else {
      lua_pop(L, 1);  /* remove a[lo] */
      lua_geti(L, 1, up);
      if (sort_comp(L, -1, -2))  /* a[up] < a[p]? */
        set2(L, p, up);  /* swap a[up] - a[p] */
      else
        lua_pop(L, 2);
    }
    if (up - lo == 2)  /* only 3 elements? */
      return;  /* already sorted */
    lua_geti(L, 1, p);  /* get middle element (Pivot) */
    lua_pushvalue(L, -1);  /* push Pivot */
    lua_geti(L, 1, up - 1);  /* push a[up - 1] */
    set2(L, p, up - 1);  /* swap Pivot (a[p]) with a[up - 1] */
    p = partition(L, lo, up);
    /* a[lo .. p - 1] <= a[p] == P <= a[p + 1 .. up] */
    if (p - lo < up - p) {  /* lower interval is smaller? */
      auxsort(L, lo, p - 1, rnd);  /* call recursively for lower interval */
      n = p - lo;  /* size of smaller interval */
      lo = p + 1;  /* tail call for [p + 1 .. up] (upper interval) */
    }
    else {
      auxsort(L, p + 1, up, rnd);  /* call recursively for upper interval */
      n = up - p;  /* size of smaller interval */
      up = p - 1;  /* tail call for [lo .. p - 1]  (lower interval) */
    }
    if ((up - lo) / 128 > n) /* partition too imbalanced? */
      rnd = l_randomizePivot();  /* try a new randomization */
  }  /* tail call auxsort(L, lo, up, rnd) */
}